

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visit
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Expression *curr)

{
  Type TVar1;
  char cVar2;
  Type TVar3;
  ostream *poVar4;
  uint uVar5;
  
  uVar5 = this->depth + 1;
  this->depth = uVar5;
  if (this->maxDepth < uVar5 && this->maxDepth != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  Visitor<wasm::ModuleRunner,_wasm::Flow>::visit
            (__return_storage_ptr__,(Visitor<wasm::ModuleRunner,_wasm::Flow> *)this,curr);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    TVar3 = Literals::getType(&__return_storage_ptr__->values);
    TVar1.id = (curr->type).id;
    if (1 < TVar1.id || 1 < TVar3.id) {
      cVar2 = wasm::Type::isSubType(TVar3,TVar1);
      if (cVar2 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cerr,"expected ");
        poVar4 = (ostream *)std::operator<<(poVar4,this->module,(curr->type).id);
        poVar4 = std::operator<<(poVar4,", seeing ");
        poVar4 = (ostream *)std::operator<<(poVar4,this->module,TVar3.id);
        poVar4 = std::operator<<(poVar4," from\n");
        poVar4 = (ostream *)std::operator<<(poVar4,this->module,curr);
        std::operator<<(poVar4,'\n');
      }
      cVar2 = wasm::Type::isSubType(TVar3,(Type)(curr->type).id);
      if (cVar2 == '\0') {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x10b,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visit(Expression *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }